

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O1

shared_ptr<const_pstore::repo::fragment> __thiscall
pstore::database::getro<pstore::repo::fragment,void>
          (database *this,extent<pstore::repo::fragment> *ex)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ulong *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<const_pstore::repo::fragment> sVar3;
  _func_int **local_20;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> local_18;
  
  if ((*in_RDX & 0xf) == 0) {
    (**(code **)((ex->addr).a_.a_ + 0x10))(&local_20,ex,*in_RDX,in_RDX[1],1,0);
    this->_vptr_database = local_20;
    (this->storage_).sat_._M_t.
    super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
    .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl =
         local_18._M_head_impl;
    if (local_18._M_head_impl != (array<pstore::sat_entry,_65536UL> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)(local_18._M_head_impl)->_M_elems + 8);
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)(local_18._M_head_impl)->_M_elems + 8);
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      }
    }
    _Var2._M_pi = extraout_RDX;
    if (local_18._M_head_impl != (array<pstore::sat_entry,_65536UL> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18._M_head_impl);
      _Var2._M_pi = extraout_RDX_00;
    }
    sVar3.super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var2._M_pi;
    sVar3.super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<const_pstore::repo::fragment>)
           sVar3.super___shared_ptr<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>;
  }
  raise<pstore::error_code>(bad_alignment);
}

Assistant:

std::shared_ptr<T const> database::getro (extent<T> const & ex) const {
        if (ex.addr.to_address ().absolute () % alignof (T) != 0) {
            raise (error_code::bad_alignment);
        }
        // Note that ex.size specifies the size in bytes of the data to be loaded, not the
        // number of elements of type T. For this reason we call the plain address version of
        // getro().
        return std::static_pointer_cast<T const> (this->getro (ex.addr.to_address (), ex.size));
    }